

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::BufferStream::~BufferStream(BufferStream *this)

{
  ~BufferStream(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~BufferStream() {}